

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O1

int h264_coded_block_flag(bitstream *str,h264_cabac_context *cabac,int cat,int idx,uint32_t *val)

{
  h264_macroblock *phVar1;
  h264_macroblock *phVar2;
  uint inter;
  uint inter_00;
  h264_block_size bs;
  h264_slice *slice;
  int iVar3;
  bool bVar4;
  int idxA;
  int idxB;
  int local_48;
  int local_44;
  uint32_t *local_40;
  bitstream *local_38;
  
  iVar3 = 0;
  local_38 = str;
  phVar1 = h264_mb_nb_p(cabac->slice,H264_MB_THIS,0);
  bVar4 = 0x1a < phVar1->mb_type;
  switch(cat) {
  case 0:
  case 1:
  case 2:
  case 5:
    break;
  case 3:
    iVar3 = idx + 1;
    break;
  case 4:
    iVar3 = (idx >> 3) + 1;
    idx = idx & 7;
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    iVar3 = 1;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    iVar3 = 2;
    break;
  default:
    goto switchD_0010e6d3_default;
  }
  if (0xd < (uint)cat) {
switchD_0010e6d3_default:
    abort();
  }
  inter = (uint)bVar4;
  inter_00 = (uint)bVar4;
  local_40 = val;
  switch(cat) {
  case 0:
  case 3:
  case 6:
  case 10:
    phVar1 = h264_mb_nb(cabac->slice,H264_MB_A,inter);
    phVar2 = h264_mb_nb(cabac->slice,H264_MB_B,inter);
    local_48 = 0x10;
    local_44 = 0x10;
    goto LAB_0010e7f9;
  default:
    phVar1 = h264_mb_nb_b(cabac->slice,H264_MB_A,H264_BLOCK_4X4,inter,idx,&local_48);
    slice = cabac->slice;
    bs = H264_BLOCK_4X4;
    break;
  case 4:
    phVar1 = h264_mb_nb_b(cabac->slice,H264_MB_A,H264_BLOCK_CHROMA,inter_00,idx,&local_48);
    slice = cabac->slice;
    bs = H264_BLOCK_CHROMA;
    break;
  case 5:
  case 9:
  case 0xd:
    phVar1 = h264_mb_nb_b(cabac->slice,H264_MB_A,H264_BLOCK_8X8,inter,idx,&local_48);
    phVar2 = h264_mb_nb_b(cabac->slice,H264_MB_B,H264_BLOCK_8X8,inter,idx,&local_44);
    local_48 = local_48 << 2;
    local_44 = local_44 << 2;
    if ((phVar1->transform_size_8x8_flag == 0) && ((phVar1->mb_type | 0x20) != 0x39)) {
      phVar1 = h264_mb_unavail(1);
    }
    if ((phVar2->transform_size_8x8_flag == 0) && ((phVar2->mb_type | 0x20) != 0x39)) {
      phVar2 = h264_mb_unavail(1);
    }
    goto LAB_0010e7f9;
  }
  phVar2 = h264_mb_nb_b(slice,H264_MB_B,bs,inter,idx,&local_44);
LAB_0010e7f9:
  phVar1 = h264_inter_filter(cabac->slice,phVar1,inter_00);
  phVar2 = h264_inter_filter(cabac->slice,phVar2,inter_00);
  iVar3 = h264_cabac_decision(local_38,cabac,
                              h264_coded_block_flag::basectx[cat] +
                              phVar1->coded_block_flag[iVar3][local_48] +
                              phVar2->coded_block_flag[iVar3][local_44] * 2,local_40);
  return iVar3;
}

Assistant:

int h264_coded_block_flag(struct bitstream *str, struct h264_cabac_context *cabac, int cat, int idx, uint32_t *val) {
	static const int basectx[14] = {
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT0,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT1,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT2,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT3,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT4,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT5,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT6,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT7,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT8,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT9,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT10,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT11,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT12,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT13,
	};
	const struct h264_macroblock *mbT = h264_mb_nb_p(cabac->slice, H264_MB_THIS, 0);
	int inter = h264_is_inter_mb_type(mbT->mb_type);
	int which;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_LUMA_8X8:
			which = 0;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CB_8X8:
			which = 1;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CR_8X8:
			which = 2;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			which = idx + 1;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			which = (idx >> 3) + 1;
			idx &= 7;
			break;
		default:
			abort();
	}
	const struct h264_macroblock *mbA;
	const struct h264_macroblock *mbB;
	int idxA;
	int idxB;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mbA = h264_mb_nb(cabac->slice, H264_MB_A, inter);
			mbB = h264_mb_nb(cabac->slice, H264_MB_B, inter);
			idxA = 16;
			idxB = 16;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_4X4, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_4X4, inter, idx, &idxB);
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
		case H264_CTXBLOCKCAT_CB_8X8:
		case H264_CTXBLOCKCAT_CR_8X8:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, inter, idx, &idxB);
			idxA *= 4;
			idxB *= 4;
			if (!mbA->transform_size_8x8_flag && mbA->mb_type != H264_MB_TYPE_I_PCM && mbA->mb_type != H264_MB_TYPE_UNAVAIL)
				mbA = h264_mb_unavail(1);;
			if (!mbB->transform_size_8x8_flag && mbB->mb_type != H264_MB_TYPE_I_PCM && mbB->mb_type != H264_MB_TYPE_UNAVAIL)
				mbB = h264_mb_unavail(1);;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_CHROMA, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_CHROMA, inter, idx, &idxB);
			break;
		default:
			abort();
	}
	mbA = h264_inter_filter(cabac->slice, mbA, inter);
	mbB = h264_inter_filter(cabac->slice, mbB, inter);
	int condTermFlagA = mbA->coded_block_flag[which][idxA];
	int condTermFlagB = mbB->coded_block_flag[which][idxB];
	int ctxIdx = basectx[cat] + condTermFlagA + condTermFlagB * 2;
	return h264_cabac_decision(str, cabac, ctxIdx, val);
}